

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O0

void __thiscall capnp::SchemaLoader::Validator::validate(Validator *this,Reader *type)

{
  Which WVar1;
  uint64_t uVar2;
  Reader local_198;
  Reader local_168;
  Reader local_138;
  undefined1 local_108 [8];
  Reader interfaceType;
  undefined1 local_a8 [8];
  Reader enumType;
  undefined1 local_48 [8];
  Reader structType;
  Reader *type_local;
  Validator *this_local;
  
  structType._reader._40_8_ = type;
  WVar1 = capnp::schema::Type::Reader::which(type);
  switch(WVar1) {
  case VOID:
  case BOOL:
  case INT8:
  case INT16:
  case INT32:
  case INT64:
  case UINT8:
  case UINT16:
  case UINT32:
  case UINT64:
  case FLOAT32:
  case FLOAT64:
  case TEXT:
  case DATA:
  case ANY_POINTER:
    break;
  case LIST:
    capnp::schema::Type::Reader::getList(&local_198,(Reader *)structType._reader._40_8_);
    capnp::schema::Type::List::Reader::getElementType(&local_168,&local_198);
    validate(this,&local_168);
    break;
  case ENUM:
    capnp::schema::Type::Reader::getEnum((Reader *)local_a8,(Reader *)structType._reader._40_8_);
    uVar2 = capnp::schema::Type::Enum::Reader::getTypeId((Reader *)local_a8);
    validateTypeId(this,uVar2,ENUM);
    capnp::schema::Type::Enum::Reader::getBrand
              ((Reader *)&interfaceType._reader.nestingLimit,(Reader *)local_a8);
    validate(this,(Reader *)&interfaceType._reader.nestingLimit);
    break;
  case STRUCT:
    capnp::schema::Type::Reader::getStruct((Reader *)local_48,(Reader *)structType._reader._40_8_);
    uVar2 = capnp::schema::Type::Struct::Reader::getTypeId((Reader *)local_48);
    validateTypeId(this,uVar2,STRUCT);
    capnp::schema::Type::Struct::Reader::getBrand
              ((Reader *)&enumType._reader.nestingLimit,(Reader *)local_48);
    validate(this,(Reader *)&enumType._reader.nestingLimit);
    break;
  case INTERFACE:
    capnp::schema::Type::Reader::getInterface
              ((Reader *)local_108,(Reader *)structType._reader._40_8_);
    uVar2 = capnp::schema::Type::Interface::Reader::getTypeId((Reader *)local_108);
    validateTypeId(this,uVar2,INTERFACE);
    capnp::schema::Type::Interface::Reader::getBrand(&local_138,(Reader *)local_108);
    validate(this,&local_138);
  }
  return;
}

Assistant:

void validate(const schema::Type::Reader& type) {
    switch (type.which()) {
      case schema::Type::VOID:
      case schema::Type::BOOL:
      case schema::Type::INT8:
      case schema::Type::INT16:
      case schema::Type::INT32:
      case schema::Type::INT64:
      case schema::Type::UINT8:
      case schema::Type::UINT16:
      case schema::Type::UINT32:
      case schema::Type::UINT64:
      case schema::Type::FLOAT32:
      case schema::Type::FLOAT64:
      case schema::Type::TEXT:
      case schema::Type::DATA:
      case schema::Type::ANY_POINTER:
        break;

      case schema::Type::STRUCT: {
        auto structType = type.getStruct();
        validateTypeId(structType.getTypeId(), schema::Node::STRUCT);
        validate(structType.getBrand());
        break;
      }
      case schema::Type::ENUM: {
        auto enumType = type.getEnum();
        validateTypeId(enumType.getTypeId(), schema::Node::ENUM);
        validate(enumType.getBrand());
        break;
      }
      case schema::Type::INTERFACE: {
        auto interfaceType = type.getInterface();
        validateTypeId(interfaceType.getTypeId(), schema::Node::INTERFACE);
        validate(interfaceType.getBrand());
        break;
      }

      case schema::Type::LIST:
        validate(type.getList().getElementType());
        break;
    }

    // We intentionally allow unknown types.
  }